

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O0

void __thiscall GUISetting::GUISetting(GUISetting *this,Fifteen *owner,BoardMode boardMode)

{
  QWidget *pQVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  type *ptVar5;
  mapped_type *pmVar6;
  QButtonGroup *pQVar7;
  type *ptVar8;
  QVBoxLayout *pQVar9;
  QGroupBox *pQVar10;
  mapped_type *pmVar11;
  type *ptVar12;
  QSlider *pQVar13;
  QGridLayout *this_00;
  QLabel *pQVar14;
  QPushButton *pQVar15;
  QHBoxLayout *this_01;
  _Elements<1UL> *__self;
  _Elements<1UL> *__self_00;
  _Elements<1UL> *__self_01;
  WidgetAttribute WVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_GraphicMode,_QRadioButton>_>,_bool> pVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_BoardSize,_QCheckBox>_>,_bool> pVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_NumberColor,_QRadioButton>_>,_bool> pVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_TileColor,_QRadioButton>_>,_bool> pVar20;
  QFlags<Qt::AlignmentFlag> local_4e0;
  QFlags<Qt::AlignmentFlag> local_4dc;
  QFlags<Qt::AlignmentFlag> local_4d8;
  QFlags<Qt::AlignmentFlag> local_4d4;
  QWidget *local_4d0;
  QHBoxLayout *layoutAccept;
  QString local_4c0;
  undefined1 local_4a1;
  QString local_4a0;
  QPushButton *local_488;
  QPushButton *pushAccept;
  QVBoxLayout layWindow;
  QString local_458;
  QGroupBox *local_440;
  QGroupBox *boxSquareSize;
  undefined1 local_42d;
  QFlags<Qt::WindowType> local_42c;
  QString local_428;
  QFlags<Qt::AlignmentFlag> local_40c;
  undefined1 local_405;
  QFlags<Qt::WindowType> local_404;
  QString local_400;
  QFlags<Qt::AlignmentFlag> local_3e4;
  undefined1 local_3dd;
  QFlags<Qt::WindowType> local_3dc;
  QString local_3d8;
  QFlags<Qt::AlignmentFlag> local_3bc;
  undefined1 local_3b5;
  QFlags<Qt::WindowType> local_3b4;
  QString local_3b0;
  QFlags<Qt::AlignmentFlag> local_394;
  undefined1 local_38d;
  QFlags<Qt::WindowType> local_38c;
  QString local_388;
  QFlags<Qt::AlignmentFlag> local_36c;
  QWidget *local_368;
  QGridLayout *layoutSlider;
  QString local_358;
  QGroupBox *local_340;
  QGroupBox *boxRadioColor;
  QFlags<Qt::AlignmentFlag> local_330;
  key_type local_32c;
  QFlags<Qt::AlignmentFlag> local_328;
  key_type local_324;
  QWidget *local_320;
  QVBoxLayout *layoutTileColor;
  type *local_300;
  type *radio_1;
  _Iterator<true> __end1_2;
  _Iterator<true> __begin1_2;
  elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
  *__range1_2;
  QButtonGroup *groupRadioColor;
  TileColor local_2b4;
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  TileColor local_29c;
  _Base_ptr local_298;
  undefined1 local_290;
  TileColor local_288;
  undefined1 local_281;
  QString local_280;
  QGroupBox *local_268;
  QGroupBox *boxRadioImage;
  QFlags<Qt::AlignmentFlag> local_258;
  key_type local_254;
  QFlags<Qt::AlignmentFlag> local_250;
  key_type local_24c;
  QFlags<Qt::AlignmentFlag> local_248;
  key_type local_244;
  QFlags<Qt::AlignmentFlag> local_240;
  key_type local_23c;
  QFlags<Qt::AlignmentFlag> local_238;
  key_type local_234;
  QFlags<Qt::AlignmentFlag> local_230;
  key_type local_22c;
  QFlags<Qt::AlignmentFlag> local_228;
  key_type local_224;
  QFlags<Qt::AlignmentFlag> local_220;
  key_type local_21c;
  QWidget *local_218;
  QVBoxLayout *layoutImages;
  type *local_1f8;
  type *radio;
  _Iterator<true> __end1_1;
  _Iterator<true> __begin1_1;
  elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
  *__range1_1;
  QButtonGroup *groupNumberOnImage;
  NumberColor local_1ac;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  NumberColor local_194;
  _Base_ptr local_190;
  undefined1 local_188;
  NumberColor local_17c;
  QString local_178;
  type *local_160;
  type *checkBox;
  _Iterator<true> __end1;
  _Iterator<true> __begin1;
  elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
  *__range1;
  _Base_ptr local_128;
  undefined1 local_120;
  BoardSize local_118;
  key_type local_114;
  _Base_ptr local_110;
  undefined1 local_108;
  BoardSize local_100;
  key_type local_fc;
  _Base_ptr local_f8;
  undefined1 local_f0;
  BoardSize local_e8;
  key_type local_e4;
  _Base_ptr local_e0;
  undefined1 local_d8;
  BoardSize local_cc;
  QString local_c8;
  key_type local_ac;
  _Base_ptr local_a8;
  undefined1 local_a0;
  GraphicMode local_94;
  QString local_90;
  key_type local_74;
  _Base_ptr local_70;
  undefined1 local_68;
  GraphicMode local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  NumberColor local_4c;
  QString local_48;
  QFlags<Qt::WindowType> local_20;
  BoardMode local_1c;
  Fifteen *pFStack_18;
  BoardMode boardMode_local;
  Fifteen *owner_local;
  GUISetting *this_local;
  
  local_1c = boardMode;
  pFStack_18 = owner;
  owner_local = (Fifteen *)this;
  QFlags<Qt::WindowType>::QFlags(&local_20);
  QDialog::QDialog(&this->super_QDialog,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_20.i);
  *(undefined ***)this = &PTR_metaObject_001637c0;
  *(undefined ***)&this->field_0x10 = &PTR__GUISetting_00163998;
  std::
  map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
  ::map(&this->mapGraphicMode);
  std::
  map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
  ::map(&this->mapImageToLoad);
  std::
  map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
  ::map(&this->mapNumberOnImage);
  std::
  map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
  ::map(&this->mapTileColor);
  this->owner = pFStack_18;
  this->boardMode = local_1c;
  QDialog::setModal(SUB81(this,0));
  QString::QString(&local_48,"");
  QWidget::setWindowTitle((QString *)this);
  QString::~QString(&local_48);
  QWidget::setGeometry((QWidget *)this,100,100,400,0x230);
  WVar16 = (WidgetAttribute)this;
  QWidget::setMaximumSize(WVar16,400);
  QWidget::setMinimumSize(WVar16,400);
  QWidget::setAttribute(WVar16,true);
  Options::readOptions();
  (this->currentOptions).numberColor = local_4c;
  (this->currentOptions).graphicMode = (undefined4)local_5c;
  (this->currentOptions).imageToLoad_4 = (bool)local_5c._4_1_;
  (this->currentOptions).imageToLoad_5 = (bool)local_5c._5_1_;
  (this->currentOptions).imageToLoad_6 = (bool)local_5c._6_1_;
  (this->currentOptions).imageToLoad_7 = (bool)local_5c._7_1_;
  (this->currentOptions).squareColor = (undefined4)uStack_54;
  (this->currentOptions).tileSize = uStack_54._4_4_;
  local_60 = SCALED;
  pVar17 = std::
           map<GraphicMode,QRadioButton,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
           ::emplace<GraphicMode,char_const(&)[14]>
                     ((map<GraphicMode,QRadioButton,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
                       *)&this->mapGraphicMode,&local_60,(char (*) [14])"Scalled image");
  local_70 = (_Base_ptr)pVar17.first._M_node;
  local_68 = pVar17.second;
  local_74 = SCALED;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](&this->mapGraphicMode,&local_74);
  QString::QString(&local_90,"margin-left: 5px");
  QWidget::setStyleSheet((QString *)pmVar3);
  QString::~QString(&local_90);
  local_94 = CROPPED;
  pVar17 = std::
           map<GraphicMode,QRadioButton,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
           ::emplace<GraphicMode,char_const(&)[14]>
                     ((map<GraphicMode,QRadioButton,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
                       *)&this->mapGraphicMode,&local_94,(char (*) [14])"Cropped image");
  local_a8 = (_Base_ptr)pVar17.first._M_node;
  local_a0 = pVar17.second;
  local_ac = CROPPED;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](&this->mapGraphicMode,&local_ac);
  QString::QString(&local_c8,"margin-left: 5px");
  QWidget::setStyleSheet((QString *)pmVar3);
  QString::~QString(&local_c8);
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](&this->mapGraphicMode,&(this->currentOptions).graphicMode);
  QAbstractButton::setChecked(SUB81(pmVar3,0));
  local_cc = FOUR;
  pVar18 = std::
           map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
           ::emplace<BoardSize,char_const(&)[26]>
                     ((map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
                       *)&this->mapImageToLoad,&local_cc,(char (*) [26])"Load image for board  4x4")
  ;
  local_e0 = (_Base_ptr)pVar18.first._M_node;
  local_d8 = pVar18.second;
  local_e4 = FOUR;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_e4);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  local_e8 = FIVE;
  pVar18 = std::
           map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
           ::emplace<BoardSize,char_const(&)[26]>
                     ((map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
                       *)&this->mapImageToLoad,&local_e8,(char (*) [26])"Load Image for board  5x5")
  ;
  local_f8 = (_Base_ptr)pVar18.first._M_node;
  local_f0 = pVar18.second;
  local_fc = FIVE;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_fc);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  local_100 = SIX;
  pVar18 = std::
           map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
           ::emplace<BoardSize,char_const(&)[26]>
                     ((map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
                       *)&this->mapImageToLoad,&local_100,(char (*) [26])"Load image for board  6x6"
                     );
  local_110 = (_Base_ptr)pVar18.first._M_node;
  local_108 = pVar18.second;
  local_114 = SIX;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_114);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  local_118 = SEVEN;
  pVar18 = std::
           map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
           ::emplace<BoardSize,char_const(&)[26]>
                     ((map<BoardSize,QCheckBox,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
                       *)&this->mapImageToLoad,&local_118,(char (*) [26])"Load image for board  7x7"
                     );
  local_128 = (_Base_ptr)pVar18.first._M_node;
  local_120 = pVar18.second;
  __range1._4_4_ = 3;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,(key_type *)((long)&__range1 + 4));
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<1UL>_&,_std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
              *)&this->mapImageToLoad,
             (map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
              *)&std::ranges::views::values,__self);
  __end1 = std::ranges::
           elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
           ::begin((elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
                    *)&__begin1);
  checkBox = (type *)std::ranges::
                     elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
                     ::end((elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
                            *)&__begin1);
  while( true ) {
    bVar2 = std::ranges::operator==(&__end1,(_Iterator<true> *)&checkBox);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ptVar5 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
             ::_Iterator<true>::operator*(&__end1);
    local_160 = ptVar5;
    QString::QString(&local_178,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)ptVar5);
    QString::~QString(&local_178);
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>_>,_1UL>
    ::_Iterator<true>::operator++(&__end1);
  }
  local_17c = NO;
  pVar19 = std::
           map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
           ::emplace<NumberColor,char_const(&)[28]>
                     ((map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
                       *)&this->mapNumberOnImage,&local_17c,
                      (char (*) [28])"Number on graphic tile : No");
  local_190 = (_Base_ptr)pVar19.first._M_node;
  local_188 = pVar19.second;
  local_194 = BLACK;
  pVar19 = std::
           map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
           ::emplace<NumberColor,char_const(&)[31]>
                     ((map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
                       *)&this->mapNumberOnImage,&local_194,
                      (char (*) [31])"Number on graphic tile : Black");
  local_1a8 = (_Base_ptr)pVar19.first._M_node;
  local_1a0 = pVar19.second;
  local_1ac = WHITE;
  std::
  map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::emplace<NumberColor,char_const(&)[31]>
            ((map<NumberColor,QRadioButton,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
              *)&this->mapNumberOnImage,&local_1ac,(char (*) [31])"Number on graphic tile : White");
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](&this->mapNumberOnImage,&(this->currentOptions).numberColor);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  pQVar7 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar7,(QObject *)0x0);
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<1UL>_&,_std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
              *)&this->mapNumberOnImage,
             (map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
              *)&std::ranges::views::values,__self_00);
  __end1_1 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
             ::begin((elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
                      *)&__begin1_1);
  radio = (type *)std::ranges::
                  elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
                  ::end((elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
                         *)&__begin1_1);
  while( true ) {
    bVar2 = std::ranges::operator==(&__end1_1,(_Iterator<true> *)&radio);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ptVar8 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
             ::_Iterator<true>::operator*(&__end1_1);
    local_1f8 = ptVar8;
    QString::QString((QString *)&layoutImages,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)ptVar8);
    QString::~QString((QString *)&layoutImages);
    QButtonGroup::addButton((QAbstractButton *)pQVar7,(int)local_1f8);
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>_>,_1UL>
    ::_Iterator<true>::operator++(&__end1_1);
  }
  pQVar9 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar9);
  local_218 = (QWidget *)pQVar9;
  QBoxLayout::addSpacing((int)pQVar9);
  pQVar1 = local_218;
  local_21c = SCALED;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](&this->mapGraphicMode,&local_21c);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_220);
  QBoxLayout::addWidget(pQVar1,(int)pmVar3,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_224 = CROPPED;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](&this->mapGraphicMode,&local_224);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_228);
  QBoxLayout::addWidget(pQVar1,(int)pmVar3,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_22c = FOUR;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_22c);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_230);
  QBoxLayout::addWidget(pQVar1,(int)pmVar4,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_234 = FIVE;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_234);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_238);
  QBoxLayout::addWidget(pQVar1,(int)pmVar4,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_23c = SIX;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_23c);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_240);
  QBoxLayout::addWidget(pQVar1,(int)pmVar4,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_244 = SEVEN;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](&this->mapImageToLoad,&local_244);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_248);
  QBoxLayout::addWidget(pQVar1,(int)pmVar4,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_24c = NO;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](&this->mapNumberOnImage,&local_24c);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_250);
  QBoxLayout::addWidget(pQVar1,(int)pmVar6,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  local_254 = BLACK;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](&this->mapNumberOnImage,&local_254);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_258);
  QBoxLayout::addWidget(pQVar1,(int)pmVar6,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar1 = local_218;
  boxRadioImage._4_4_ = 2;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](&this->mapNumberOnImage,(key_type *)((long)&boxRadioImage + 4));
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&boxRadioImage);
  QBoxLayout::addWidget(pQVar1,(int)pmVar6,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_218);
  pQVar10 = (QGroupBox *)operator_new(0x28);
  local_281 = 1;
  QString::QString(&local_280,"Image for a graphic board");
  QGroupBox::QGroupBox(pQVar10,(QString *)&local_280,(QWidget *)0x0);
  local_281 = 0;
  QString::~QString(&local_280);
  local_268 = pQVar10;
  QWidget::setLayout((QLayout *)pQVar10);
  local_288 = BLUE;
  pVar20 = std::
           map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
           ::emplace<TileColor,char_const(&)[5]>
                     ((map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
                       *)&this->mapTileColor,&local_288,(char (*) [5])"Blue");
  local_298 = (_Base_ptr)pVar20.first._M_node;
  local_290 = pVar20.second;
  local_29c = GREEN;
  pVar20 = std::
           map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
           ::emplace<TileColor,char_const(&)[6]>
                     ((map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
                       *)&this->mapTileColor,&local_29c,(char (*) [6])"Green");
  local_2b0 = (_Base_ptr)pVar20.first._M_node;
  local_2a8 = pVar20.second;
  local_2b4 = RED;
  std::
  map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::emplace<TileColor,char_const(&)[4]>
            ((map<TileColor,QRadioButton,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
              *)&this->mapTileColor,&local_2b4,(char (*) [4])"Red");
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[](&this->mapTileColor,&(this->currentOptions).squareColor);
  QAbstractButton::setChecked(SUB81(pmVar11,0));
  pQVar7 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar7,(QObject *)0x0);
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<1UL>_&,_std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
              *)&this->mapTileColor,
             (map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
              *)&std::ranges::views::values,__self_01);
  __end1_2 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
             ::begin((elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
                      *)&__begin1_2);
  radio_1 = (type *)std::ranges::
                    elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
                    ::end((elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
                           *)&__begin1_2);
  while( true ) {
    bVar2 = std::ranges::operator==(&__end1_2,(_Iterator<true> *)&radio_1);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ptVar12 = std::ranges::
              elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
              ::_Iterator<true>::operator*(&__end1_2);
    local_300 = ptVar12;
    QString::QString((QString *)&layoutTileColor,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)ptVar12);
    QString::~QString((QString *)&layoutTileColor);
    QButtonGroup::addButton((QAbstractButton *)pQVar7,(int)local_300);
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>_>,_1UL>
    ::_Iterator<true>::operator++(&__end1_2);
  }
  pQVar9 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar9);
  local_320 = (QWidget *)pQVar9;
  QBoxLayout::addSpacing((int)pQVar9);
  pQVar1 = local_320;
  local_324 = BLUE;
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[](&this->mapTileColor,&local_324);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_328);
  QBoxLayout::addWidget(pQVar1,(int)pmVar11,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_320);
  pQVar1 = local_320;
  local_32c = GREEN;
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[](&this->mapTileColor,&local_32c);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_330);
  QBoxLayout::addWidget(pQVar1,(int)pmVar11,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_320);
  pQVar1 = local_320;
  boxRadioColor._4_4_ = 2;
  pmVar11 = std::
            map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
            ::operator[](&this->mapTileColor,(key_type *)((long)&boxRadioColor + 4));
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&boxRadioColor);
  QBoxLayout::addWidget(pQVar1,(int)pmVar11,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_320);
  pQVar10 = (QGroupBox *)operator_new(0x28);
  layoutSlider._7_1_ = 1;
  QString::QString(&local_358,"Color of numeric board");
  QGroupBox::QGroupBox(pQVar10,(QString *)&local_358,(QWidget *)0x0);
  layoutSlider._7_1_ = 0;
  QString::~QString(&local_358);
  local_340 = pQVar10;
  QWidget::setLayout((QLayout *)pQVar10);
  pQVar13 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar13,Horizontal,(QWidget *)this);
  this->slider = pQVar13;
  QAbstractSlider::setRange((int)this->slider,0);
  QAbstractSlider::setSingleStep((int)this->slider);
  pQVar13 = this->slider;
  Maps::getSliderByTileSize((this->currentOptions).tileSize);
  QAbstractSlider::setValue((int)pQVar13);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)0x0);
  local_368 = (QWidget *)this_00;
  QLayout::setContentsMargins((int)this_00,10,0x14,0x1e);
  pQVar1 = local_368;
  pQVar13 = this->slider;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_36c);
  QGridLayout::addWidget(pQVar1,(int)pQVar13,0,0,1,(QFlags_conflict *)0x5);
  pQVar1 = local_368;
  pQVar14 = (QLabel *)operator_new(0x28);
  local_38d = 1;
  QString::QString(&local_388," 50");
  QFlags<Qt::WindowType>::QFlags(&local_38c);
  QLabel::QLabel(pQVar14,(QString *)&local_388,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_38c.i)
  ;
  local_38d = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_394,AlignLeading);
  QGridLayout::addWidget(pQVar1,(int)pQVar14,1,0,1,(QFlags_conflict *)0x1);
  QString::~QString(&local_388);
  pQVar1 = local_368;
  pQVar14 = (QLabel *)operator_new(0x28);
  local_3b5 = 1;
  QString::QString(&local_3b0,"   75");
  QFlags<Qt::WindowType>::QFlags(&local_3b4);
  QLabel::QLabel(pQVar14,(QString *)&local_3b0,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_3b4.i)
  ;
  local_3b5 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_3bc,AlignLeading);
  QGridLayout::addWidget(pQVar1,(int)pQVar14,1,1,1,(QFlags_conflict *)0x1);
  QString::~QString(&local_3b0);
  pQVar1 = local_368;
  pQVar14 = (QLabel *)operator_new(0x28);
  local_3dd = 1;
  QString::QString(&local_3d8,"100");
  QFlags<Qt::WindowType>::QFlags(&local_3dc);
  QLabel::QLabel(pQVar14,(QString *)&local_3d8,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_3dc.i)
  ;
  local_3dd = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_3e4,AlignCenter);
  QGridLayout::addWidget(pQVar1,(int)pQVar14,1,2,1,(QFlags_conflict *)0x1);
  QString::~QString(&local_3d8);
  pQVar1 = local_368;
  pQVar14 = (QLabel *)operator_new(0x28);
  local_405 = 1;
  QString::QString(&local_400,"125  ");
  QFlags<Qt::WindowType>::QFlags(&local_404);
  QLabel::QLabel(pQVar14,(QString *)&local_400,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_404.i)
  ;
  local_405 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_40c,AlignRight);
  QGridLayout::addWidget(pQVar1,(int)pQVar14,1,3,1,(QFlags_conflict *)0x1);
  QString::~QString(&local_400);
  pQVar1 = local_368;
  pQVar14 = (QLabel *)operator_new(0x28);
  local_42d = 1;
  QString::QString(&local_428,"150");
  QFlags<Qt::WindowType>::QFlags(&local_42c);
  QLabel::QLabel(pQVar14,(QString *)&local_428,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_42c.i)
  ;
  local_42d = 0;
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)((long)&boxSquareSize + 4),AlignRight);
  QGridLayout::addWidget(pQVar1,(int)pQVar14,1,4,1,(QFlags_conflict *)0x1);
  QString::~QString(&local_428);
  pQVar10 = (QGroupBox *)operator_new(0x28);
  QString::QString(&local_458,"Size of tile");
  QGroupBox::QGroupBox(pQVar10,(QString *)&local_458,(QWidget *)0x0);
  QString::~QString(&local_458);
  local_440 = pQVar10;
  QWidget::setLayout((QLayout *)pQVar10);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)&pushAccept);
  pQVar15 = (QPushButton *)operator_new(0x28);
  local_4a1 = 1;
  QString::QString(&local_4a0,"Accept");
  QPushButton::QPushButton(pQVar15,(QString *)&local_4a0,(QWidget *)0x0);
  local_4a1 = 0;
  QString::~QString(&local_4a0);
  local_488 = pQVar15;
  QString::QString(&local_4c0,"height:20px;");
  QWidget::setStyleSheet((QString *)pQVar15);
  QString::~QString(&local_4c0);
  QObject::connect((QObject *)&layoutAccept,(char *)local_488,(QObject *)"2clicked()",(char *)this,
                   0x141d54);
  QMetaObject::Connection::~Connection((Connection *)&layoutAccept);
  this_01 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_01);
  local_4d0 = (QWidget *)this_01;
  QBoxLayout::addSpacing((int)this_01);
  pQVar15 = local_488;
  pQVar1 = local_4d0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4d4);
  QBoxLayout::addWidget(pQVar1,(int)pQVar15,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)local_4d0);
  QBoxLayout::addSpacing((int)&pushAccept);
  pQVar10 = local_268;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4d8);
  QBoxLayout::addWidget((QWidget *)&pushAccept,(int)pQVar10,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)&pushAccept);
  pQVar10 = local_340;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4dc);
  QBoxLayout::addWidget((QWidget *)&pushAccept,(int)pQVar10,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)&pushAccept);
  pQVar10 = local_440;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4e0);
  QBoxLayout::addWidget((QWidget *)&pushAccept,(int)pQVar10,(QFlags_conflict *)0x0);
  QBoxLayout::addSpacing((int)&pushAccept);
  QBoxLayout::addLayout((QLayout *)&pushAccept,(int)local_4d0);
  QBoxLayout::addSpacing((int)&pushAccept);
  QBoxLayout::addStretch((int)&pushAccept);
  QWidget::setLayout((QLayout *)this);
  QWidget::show();
  QVBoxLayout::~QVBoxLayout((QVBoxLayout *)&pushAccept);
  return;
}

Assistant:

GUISetting::GUISetting( Fifteen& owner, BoardMode boardMode ) : owner( owner ), boardMode( boardMode )
{
    setModal( true );
    setWindowTitle( "" );
    setGeometry( 100, 100, 400, 560 );
    setMaximumSize( 400, 800 );
    setMinimumSize( 400, 800 );
    setAttribute( Qt::WA_DeleteOnClose );

    currentOptions = Options::readOptions();

    /* Graphic loading box *****************************************/

    mapGraphicMode.emplace( GraphicMode::SCALED, "Scalled image");
    mapGraphicMode[GraphicMode::SCALED].setStyleSheet( STYLE_MARGIN_LEFT );
    
    mapGraphicMode.emplace( GraphicMode::CROPPED, "Cropped image" );
    mapGraphicMode[GraphicMode::CROPPED].setStyleSheet( STYLE_MARGIN_LEFT );
    mapGraphicMode[currentOptions.graphicMode].setChecked( true );

    mapImageToLoad.emplace( BoardSize::FOUR, "Load image for board  4x4" );
    mapImageToLoad[BoardSize::FOUR].setChecked( currentOptions.imageToLoad_4 );
    
    mapImageToLoad.emplace( BoardSize::FIVE, "Load Image for board  5x5" );
    mapImageToLoad[BoardSize::FIVE].setChecked( currentOptions.imageToLoad_5 );
    
    mapImageToLoad.emplace( BoardSize::SIX, "Load image for board  6x6" );
    mapImageToLoad[BoardSize::SIX].setChecked( currentOptions.imageToLoad_6 );
    
    mapImageToLoad.emplace( BoardSize::SEVEN, "Load image for board  7x7" );
    mapImageToLoad[BoardSize::SEVEN].setChecked( currentOptions.imageToLoad_7 );

    for ( auto& checkBox : mapImageToLoad | std::views::values )
    {
        checkBox.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    mapNumberOnImage.emplace( NumberColor::NO, "Number on graphic tile : No" );
    mapNumberOnImage.emplace( NumberColor::BLACK, "Number on graphic tile : Black" );
    mapNumberOnImage.emplace( NumberColor::WHITE, "Number on graphic tile : White" );
    mapNumberOnImage[currentOptions.numberColor].setChecked( true );

    QButtonGroup* groupNumberOnImage = new QButtonGroup();
    for ( auto& radio : mapNumberOnImage | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupNumberOnImage->addButton( &radio );
    }

    QVBoxLayout* layoutImages = new QVBoxLayout();
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::SCALED] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::CROPPED] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FOUR] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FIVE] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SIX] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SEVEN] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::NO] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::BLACK] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::WHITE] );
    layoutImages->addSpacing( 15 );

    QGroupBox* boxRadioImage = new QGroupBox( "Image for a graphic board" );
    boxRadioImage->setLayout( layoutImages );

    /* Color of numeric board **************************************/

    mapTileColor.emplace(TileColor::BLUE, "Blue" );
    mapTileColor.emplace(TileColor::GREEN, "Green" );
    mapTileColor.emplace(TileColor::RED, "Red" );
    mapTileColor[currentOptions.squareColor].setChecked( true );

    QButtonGroup* groupRadioColor = new QButtonGroup();
    for ( auto& radio : mapTileColor | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupRadioColor->addButton( &radio );
    }   

    QVBoxLayout* layoutTileColor = new QVBoxLayout();
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::BLUE] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::GREEN] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::RED] );
    layoutTileColor->addSpacing( 7 );

    QGroupBox* boxRadioColor = new QGroupBox( "Color of numeric board" );
    boxRadioColor->setLayout( layoutTileColor );

    /* Slider for square size **************************************/

    slider = new QSlider( Qt::Horizontal, this );
    slider->setRange( 0, 4 );
    slider->setSingleStep( 1 );
    slider->setValue( Maps::getSliderByTileSize( currentOptions.tileSize ));

    QGridLayout* layoutSlider = new QGridLayout();
    layoutSlider->setContentsMargins( 10, 20, 30, 20 );
    layoutSlider->addWidget( slider,          0, 0, 1, 5 );
    layoutSlider->addWidget( new QLabel( " 50" ),   1, 0, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "   75" ), 1, 1, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "100" ),   1, 2, 1, 1, Qt::AlignCenter );
    layoutSlider->addWidget( new QLabel( "125  " ), 1, 3, 1, 1, Qt::AlignRight );
    layoutSlider->addWidget( new QLabel( "150" ),   1, 4, 1, 1, Qt::AlignRight );

    QGroupBox* boxSquareSize = new QGroupBox( "Size of tile" );
    boxSquareSize->setLayout( layoutSlider );

    /* General layout **********************************************/

    QVBoxLayout layWindow;

    QPushButton* pushAccept = new QPushButton( "Accept" );
    pushAccept->setStyleSheet( "height:20px;" );
    connect( pushAccept, SIGNAL( clicked() ), this, SLOT( acceptSettings() ));

    QHBoxLayout* layoutAccept = new QHBoxLayout();
    layoutAccept->addSpacing( 120 );
    layoutAccept->addWidget( pushAccept );
    layoutAccept->addSpacing( 120 );

    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioImage );
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioColor);
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxSquareSize );
    layWindow.addSpacing( 20 );
    layWindow.addLayout( layoutAccept );
    layWindow.addSpacing( 10 );
    layWindow.addStretch();

    this->setLayout( &layWindow );
    this->show();
}